

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cmf5kb_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double ti2;
  double cr4;
  double cr5;
  double cr3;
  double cr2;
  double di2;
  double di5;
  double di4;
  double di3;
  int m1d;
  double ci5;
  double ci4;
  double ci3;
  double ci2;
  int m2;
  int m1;
  int k;
  int i__;
  int i__4;
  int i__3;
  int i__2;
  int i__1;
  int wa_offset;
  int wa_dim1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int cc_offset;
  int cc_dim4;
  int cc_dim3;
  int cc_dim2;
  double ti12;
  double tr12;
  double ti11;
  double tr11;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  double chold2;
  double chold1;
  double tr5;
  double tr4;
  double tr3;
  double tr2;
  double dr2;
  double dr5;
  double dr4;
  double dr3;
  double ti5;
  int m2s;
  double ti4;
  double ti3;
  
  iVar1 = *in_RSI;
  lVar13 = (long)di2 + (long)(iVar1 * 5 + 1) * -8;
  iVar2 = *(int *)cr4;
  iVar3 = *in_RDX;
  iVar4 = *in_RSI;
  lVar14 = in_R8 + (long)((iVar2 * (iVar3 * (iVar4 + 1) + 1) + 1) * 2 + 1) * -8;
  iVar5 = *(int *)cr2;
  iVar6 = *in_RDX;
  lVar15 = (long)cr5 + (long)((iVar5 * (iVar6 * 6 + 1) + 1) * 2 + 1) * -8;
  iVar12 = (*in_RDI + -1) * *in_R9 + 1;
  iVar7 = *(int *)cr3;
  if ((*in_RSI < 2) && (*in_RCX != 1)) {
    iVar1 = *in_RDX;
    for (local_94 = 1; local_94 <= iVar1; local_94 = local_94 + 1) {
      iVar5 = *in_R9;
      local_98 = 1;
      while( true ) {
        if (iVar5 < 0) {
          bVar11 = iVar12 <= local_98;
        }
        else {
          bVar11 = local_98 <= iVar12;
        }
        if (!bVar11) break;
        dVar20 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar21 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar22 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar23 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar24 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar25 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar26 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar27 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar19 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8);
        dVar28 = dVar27 * -0.8090169943749475 +
                 dVar25 * 0.3090169943749474 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8);
        dVar16 = dVar23 * -0.8090169943749475 +
                 dVar21 * 0.3090169943749474 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8);
        dVar17 = dVar27 * 0.3090169943749474 +
                 dVar25 * -0.8090169943749475 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8);
        dVar18 = dVar23 * 0.3090169943749474 +
                 dVar21 * -0.8090169943749475 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8);
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
             *(double *)
              (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) * 8) +
             dVar25 + dVar27;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
             dVar19 + dVar21 + dVar23;
        dVar19 = dVar24 * 0.9510565162951536 + dVar26 * 0.5877852522924731;
        dVar21 = dVar20 * 0.9510565162951536 + dVar22 * 0.5877852522924731;
        dVar23 = dVar24 * 0.5877852522924731 + -(dVar26 * 0.9510565162951536);
        dVar20 = dVar20 * 0.5877852522924731 + -(dVar22 * 0.9510565162951536);
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
             dVar28 - dVar21;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
             dVar28 + dVar21;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
             dVar16 + dVar19;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
             dVar18 + dVar23;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
             dVar17 - dVar20;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
             dVar17 + dVar20;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
             dVar18 - dVar23;
        *(double *)
         (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
             dVar16 - dVar19;
        local_98 = iVar5 + local_98;
      }
    }
  }
  else {
    iVar8 = *in_RDX;
    for (local_94 = 1; local_94 <= iVar8; local_94 = local_94 + 1) {
      iVar9 = *in_R9;
      local_98 = 1;
      local_9c = 1 - iVar7;
      while( true ) {
        if (iVar9 < 0) {
          bVar11 = iVar12 <= local_98;
        }
        else {
          bVar11 = local_98 <= iVar12;
        }
        if (!bVar11) break;
        local_9c = *(int *)cr3 + local_9c;
        dVar19 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar20 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar21 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar22 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar23 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar24 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 5 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar25 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar26 = *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 6) * iVar5) * 2 + 1) * 8) =
             *(double *)
              (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) * 8) +
             dVar24 + dVar26;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 6) * iVar5) * 2 + 2) * 8) =
             *(double *)
              (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) * 8) +
             dVar20 + dVar22;
        dVar27 = dVar26 * -0.8090169943749475 +
                 dVar24 * 0.3090169943749474 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8);
        dVar28 = dVar22 * -0.8090169943749475 +
                 dVar20 * 0.3090169943749474 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8);
        dVar24 = dVar26 * 0.3090169943749474 +
                 dVar24 * -0.8090169943749475 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8);
        dVar20 = dVar22 * 0.3090169943749474 +
                 dVar20 * -0.8090169943749475 +
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8);
        dVar22 = dVar23 * 0.9510565162951536 + dVar25 * 0.5877852522924731;
        dVar26 = dVar19 * 0.9510565162951536 + dVar21 * 0.5877852522924731;
        dVar23 = dVar23 * 0.5877852522924731 + -(dVar25 * 0.9510565162951536);
        dVar19 = dVar19 * 0.5877852522924731 + -(dVar21 * 0.9510565162951536);
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 7) * iVar5) * 2 + 1) * 8) =
             dVar27 - dVar26;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 10) * iVar5) * 2 + 1) * 8) =
             dVar27 + dVar26;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 7) * iVar5) * 2 + 2) * 8) =
             dVar28 + dVar22;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 8) * iVar5) * 2 + 2) * 8) =
             dVar20 + dVar23;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 8) * iVar5) * 2 + 1) * 8) =
             dVar24 - dVar19;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 9) * iVar5) * 2 + 1) * 8) =
             dVar24 + dVar19;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 9) * iVar5) * 2 + 2) * 8) =
             dVar20 - dVar23;
        *(double *)(lVar15 + (long)((local_9c + (local_94 + iVar6 * 10) * iVar5) * 2 + 2) * 8) =
             dVar28 - dVar22;
        local_98 = iVar9 + local_98;
      }
    }
    if (*in_RSI != 1) {
      iVar8 = *in_RSI;
      for (local_90 = 2; local_90 <= iVar8; local_90 = local_90 + 1) {
        iVar9 = *in_RDX;
        for (local_94 = 1; local_94 <= iVar9; local_94 = local_94 + 1) {
          iVar10 = *in_R9;
          local_98 = 1;
          local_9c = 1 - iVar7;
          while( true ) {
            if (iVar10 < 0) {
              bVar11 = iVar12 <= local_98;
            }
            else {
              bVar11 = local_98 <= iVar12;
            }
            if (!bVar11) break;
            local_9c = *(int *)cr3 + local_9c;
            dVar19 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 2) * iVar3) * iVar2) * 2 + 2)
                                * 8) -
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 5) * iVar3) * iVar2) * 2 + 2)
                                * 8);
            dVar20 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 2) * iVar3) * iVar2) * 2 + 2)
                                * 8) +
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 5) * iVar3) * iVar2) * 2 + 2)
                                * 8);
            dVar21 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 3) * iVar3) * iVar2) * 2 + 2)
                                * 8) -
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 4) * iVar3) * iVar2) * 2 + 2)
                                * 8);
            dVar22 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 3) * iVar3) * iVar2) * 2 + 2)
                                * 8) +
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 4) * iVar3) * iVar2) * 2 + 2)
                                * 8);
            dVar23 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 2) * iVar3) * iVar2) * 2 + 1)
                                * 8) -
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 5) * iVar3) * iVar2) * 2 + 1)
                                * 8);
            dVar24 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 2) * iVar3) * iVar2) * 2 + 1)
                                * 8) +
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 5) * iVar3) * iVar2) * 2 + 1)
                                * 8);
            dVar25 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 3) * iVar3) * iVar2) * 2 + 1)
                                * 8) -
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 4) * iVar3) * iVar2) * 2 + 1)
                                * 8);
            dVar26 = *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 3) * iVar3) * iVar2) * 2 + 1)
                                * 8) +
                     *(double *)
                      (lVar14 + (long)((local_98 +
                                       (local_94 + (local_90 + iVar4 * 4) * iVar3) * iVar2) * 2 + 1)
                                * 8);
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 1) * iVar6) * iVar5) * 2 + 1)
                       * 8) =
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2) * 2
                                  + 1) * 8) + dVar24 + dVar26;
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 1) * iVar6) * iVar5) * 2 + 2)
                       * 8) =
                 *(double *)
                  (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2) * 2
                                  + 2) * 8) + dVar20 + dVar22;
            dVar27 = dVar26 * -0.8090169943749475 +
                     dVar24 * 0.3090169943749474 +
                     *(double *)
                      (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2)
                                       * 2 + 1) * 8);
            dVar28 = dVar22 * -0.8090169943749475 +
                     dVar20 * 0.3090169943749474 +
                     *(double *)
                      (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2)
                                       * 2 + 2) * 8);
            dVar24 = dVar26 * 0.3090169943749474 +
                     dVar24 * -0.8090169943749475 +
                     *(double *)
                      (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2)
                                       * 2 + 1) * 8);
            dVar26 = dVar22 * 0.3090169943749474 +
                     dVar20 * -0.8090169943749475 +
                     *(double *)
                      (lVar14 + (long)((local_98 + (local_94 + (local_90 + iVar4) * iVar3) * iVar2)
                                       * 2 + 2) * 8);
            dVar20 = dVar23 * 0.9510565162951536 + dVar25 * 0.5877852522924731;
            dVar22 = dVar19 * 0.9510565162951536 + dVar21 * 0.5877852522924731;
            dVar23 = dVar23 * 0.5877852522924731 + -(dVar25 * 0.9510565162951536);
            dVar19 = dVar19 * 0.5877852522924731 + -(dVar21 * 0.9510565162951536);
            dVar21 = dVar24 - dVar19;
            dVar24 = dVar24 + dVar19;
            dVar19 = dVar26 + dVar23;
            dVar26 = dVar26 - dVar23;
            dVar23 = dVar27 + dVar22;
            dVar27 = dVar27 - dVar22;
            dVar22 = dVar28 - dVar20;
            dVar28 = dVar28 + dVar20;
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 2) * iVar6) * iVar5) * 2 + 1)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 5) * 8) * dVar27 +
                 -(*(double *)(lVar13 + (long)(local_90 + iVar1 * 9) * 8) * dVar28);
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 2) * iVar6) * iVar5) * 2 + 2)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 5) * 8) * dVar28 +
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 9) * 8) * dVar27;
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 3) * iVar6) * iVar5) * 2 + 1)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 6) * 8) * dVar21 +
                 -(*(double *)(lVar13 + (long)(local_90 + iVar1 * 10) * 8) * dVar19);
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 3) * iVar6) * iVar5) * 2 + 2)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 6) * 8) * dVar19 +
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 10) * 8) * dVar21;
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 4) * iVar6) * iVar5) * 2 + 1)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 7) * 8) * dVar24 +
                 -(*(double *)(lVar13 + (long)(local_90 + iVar1 * 0xb) * 8) * dVar26);
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 4) * iVar6) * iVar5) * 2 + 2)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 7) * 8) * dVar26 +
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 0xb) * 8) * dVar24;
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 5) * iVar6) * iVar5) * 2 + 1)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 8) * 8) * dVar23 +
                 -(*(double *)(lVar13 + (long)(local_90 + iVar1 * 0xc) * 8) * dVar22);
            *(double *)
             (lVar15 + (long)((local_9c + (local_94 + (local_90 * 5 + 5) * iVar6) * iVar5) * 2 + 2)
                       * 8) =
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 8) * 8) * dVar22 +
                 *(double *)(lVar13 + (long)(local_90 + iVar1 * 0xc) * 8) * dVar23;
            local_98 = iVar10 + local_98;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int cmf5kb_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t ci2, ci3, ci4, ci5;
     int m1d;
     fft_real_t di3, di4, di5, di2, cr2, cr3, cr5, cr4, ti2, ti3, ti4;
     int m2s;
     fft_real_t ti5, dr3, dr4, dr5, dr2, tr2, tr3, tr4, tr5, chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 6));
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.0 auxiliary routine */

    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    chold1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    1] + tr2 + tr3;
	    chold2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    chold1;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    chold2;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr2 - ci5;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr2 + ci5;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci2 + cr5;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci3 + cr4;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr3 - ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr3 + ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci3 - cr4;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci2 - cr5;
/* L101: */
	}
    }
    return 0;
L102:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] + tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = cr2 - ci5;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 1] = cr2 + ci5;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ci2 + cr5;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ci3 + cr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = cr3 - ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 1] = cr3 + ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 2] = ci3 - cr4;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 2] = ci2 - cr5;
/* L103: */
	}
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ti5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		tr5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 1] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 1] + tr2 + tr3;
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 2] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 2] + ti2 + ti3;
		cr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr11 * tr2 + tr12 * tr3;
		ci2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr11 * ti2 + tr12 * ti3;
		cr3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr12 * tr2 + tr11 * tr3;
		ci3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr12 * ti2 + tr11 * ti3;
		cr5 = ti11 * tr5 + ti12 * tr4;
		ci5 = ti11 * ti5 + ti12 * ti4;
		cr4 = ti12 * tr5 - ti11 * tr4;
		ci4 = ti12 * ti5 - ti11 * ti4;
		dr3 = cr3 - ci4;
		dr4 = cr3 + ci4;
		di3 = ci3 + cr4;
		di4 = ci3 - cr4;
		dr5 = cr2 + ci5;
		dr2 = cr2 - ci5;
		di5 = ci2 - cr5;
		di2 = ci2 + cr5;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] *
			di2;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] *
			dr2;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] *
			 di3;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] *
			 dr3;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] *
			 di4;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] *
			 dr4;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + (wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 *
			12] * di5;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + (wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 *
			12] * dr5;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}